

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::anon_unknown_1::getPackInfo
               (TextureFormat texFormat,IVec4 *bitSizes,IVec4 *bitOffsets,int *baseTypeBytes)

{
  Vector<int,_4> local_148;
  Vector<int,_4> local_138;
  Vector<int,_4> local_128;
  Vector<int,_4> local_118;
  Vector<int,_4> local_108;
  Vector<int,_4> local_f8;
  Vector<int,_4> local_e8;
  Vector<int,_4> local_d8;
  Vector<int,_4> local_c8;
  Vector<int,_4> local_b8;
  Vector<int,_4> local_a8;
  Vector<int,_4> local_98;
  Vector<int,_4> local_88;
  Vector<int,_4> local_78;
  Vector<int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<int,_4> local_38;
  int *local_28;
  int *baseTypeBytes_local;
  IVec4 *bitOffsets_local;
  IVec4 *bitSizes_local;
  TextureFormat texFormat_local;
  
  bitSizes_local._4_4_ = texFormat.type;
  local_28 = baseTypeBytes;
  baseTypeBytes_local = bitOffsets->m_data;
  bitOffsets_local = bitSizes;
  bitSizes_local = (IVec4 *)texFormat;
  switch(bitSizes_local._4_4_) {
  case UNORM_BYTE_44:
    tcu::Vector<int,_4>::Vector(&local_38,4,4,0,0);
    *(undefined8 *)bitOffsets_local->m_data = local_38.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_38.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_48,0,4,0,0);
    *(undefined8 *)baseTypeBytes_local = local_48.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_48.m_data._8_8_;
    *local_28 = 1;
    break;
  case UNORM_SHORT_565:
    tcu::Vector<int,_4>::Vector(&local_58,5,6,5,0);
    *(undefined8 *)bitOffsets_local->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_58.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_68,0,5,0xb,0);
    *(undefined8 *)baseTypeBytes_local = local_68.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_68.m_data._8_8_;
    *local_28 = 2;
    break;
  case UNORM_SHORT_555:
    tcu::Vector<int,_4>::Vector(&local_78,5,5,5,0);
    *(undefined8 *)bitOffsets_local->m_data = local_78.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_78.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_88,0,5,10,0);
    *(undefined8 *)baseTypeBytes_local = local_88.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_88.m_data._8_8_;
    *local_28 = 2;
    break;
  case UNORM_SHORT_4444:
    tcu::Vector<int,_4>::Vector(&local_98,4,4,4,4);
    *(undefined8 *)bitOffsets_local->m_data = local_98.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_98.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_a8,0,4,8,0xc);
    *(undefined8 *)baseTypeBytes_local = local_a8.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_a8.m_data._8_8_;
    *local_28 = 2;
    break;
  case UNORM_SHORT_5551:
    tcu::Vector<int,_4>::Vector(&local_b8,5,5,5,1);
    *(undefined8 *)bitOffsets_local->m_data = local_b8.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_b8.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_c8,0,5,10,0xf);
    *(undefined8 *)baseTypeBytes_local = local_c8.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_c8.m_data._8_8_;
    *local_28 = 2;
    break;
  case UNORM_SHORT_1555:
    tcu::Vector<int,_4>::Vector(&local_d8,1,5,5,5);
    *(undefined8 *)bitOffsets_local->m_data = local_d8.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_d8.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_e8,0,1,6,0xb);
    *(undefined8 *)baseTypeBytes_local = local_e8.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_e8.m_data._8_8_;
    *local_28 = 2;
    break;
  case UNORM_INT_101010:
    tcu::Vector<int,_4>::Vector(&local_f8,10,10,10,0);
    *(undefined8 *)bitOffsets_local->m_data = local_f8.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_f8.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_108,0,10,0x14,0);
    *(undefined8 *)baseTypeBytes_local = local_108.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_108.m_data._8_8_;
    *local_28 = 4;
    break;
  case SNORM_INT_1010102_REV:
    tcu::Vector<int,_4>::Vector(&local_118,2,10,10,10);
    *(undefined8 *)bitOffsets_local->m_data = local_118.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_118.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_128,0,2,0xc,0x16);
    *(undefined8 *)baseTypeBytes_local = local_128.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_128.m_data._8_8_;
    *local_28 = 4;
    break;
  case UNORM_INT_1010102_REV:
    tcu::Vector<int,_4>::Vector(&local_138,2,10,10,10);
    *(undefined8 *)bitOffsets_local->m_data = local_138.m_data._0_8_;
    *(undefined8 *)(bitOffsets_local->m_data + 2) = local_138.m_data._8_8_;
    tcu::Vector<int,_4>::Vector(&local_148,0,2,0xc,0x16);
    *(undefined8 *)baseTypeBytes_local = local_148.m_data._0_8_;
    *(undefined8 *)(baseTypeBytes_local + 2) = local_148.m_data._8_8_;
    *local_28 = 4;
  }
  return;
}

Assistant:

void getPackInfo (const TextureFormat texFormat,
				  IVec4& bitSizes,
				  IVec4& bitOffsets,
				  int& baseTypeBytes)
{
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (texFormat.type)
	{
		case TextureFormat::UNORM_BYTE_44:
			bitSizes = IVec4(4, 4, 0, 0);
			bitOffsets = IVec4(0, 4, 0, 0);
			baseTypeBytes = 1;
			break;

		case TextureFormat::UNORM_SHORT_565:
			bitSizes = IVec4(5, 6, 5, 0);
			bitOffsets = IVec4(0, 5, 11, 0);
			baseTypeBytes = 2;
			break;

		case TextureFormat::UNORM_SHORT_555:
			bitSizes = IVec4(5, 5, 5, 0);
			bitOffsets = IVec4(0, 5, 10, 0);
			baseTypeBytes = 2;
			break;

		case TextureFormat::UNORM_SHORT_4444:
			bitSizes = IVec4(4, 4, 4, 4);
			bitOffsets = IVec4(0, 4, 8, 12);
			baseTypeBytes = 2;
			break;

		case TextureFormat::UNORM_SHORT_5551:
			bitSizes = IVec4(5, 5, 5, 1);
			bitOffsets = IVec4(0, 5, 10, 15);
			baseTypeBytes = 2;
			break;

		case TextureFormat::UNORM_SHORT_1555:
			bitSizes = IVec4(1, 5, 5, 5);
			bitOffsets = IVec4(0, 1, 6, 11);
			baseTypeBytes = 2;
			break;

		case TextureFormat::UNORM_INT_101010:
			bitSizes = IVec4(10, 10, 10, 0);
			bitOffsets = IVec4(0, 10, 20, 0);
			baseTypeBytes = 4;
			break;

		case TextureFormat::SNORM_INT_1010102_REV:
			bitSizes = IVec4(2, 10, 10, 10);
			bitOffsets = IVec4(0, 2, 12, 22);
			baseTypeBytes = 4;
			break;

		case TextureFormat::UNORM_INT_1010102_REV:
			bitSizes = IVec4(2, 10, 10, 10);
			bitOffsets = IVec4(0, 2, 12, 22);
			baseTypeBytes = 4;
			break;

		default:
			DE_FATAL("Invalid texture channel type");
			return;
	}
}